

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timidity.cpp
# Opt level: O1

void __thiscall
Timidity::Renderer::MarkInstrument(Renderer *this,int banknum,int percussion,int instr)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  long *plVar4;
  
  if (banknum < 0x80) {
    lVar2 = (long)instr;
    if (banknum != 0) {
      plVar4 = &drumset;
      if (percussion == 0) {
        plVar4 = &tonebank;
      }
      lVar1 = *plVar4;
      if ((lVar1 != 0) && (*(long *)(lVar1 + 8 + lVar2 * 8) == 0)) {
        *(undefined8 *)(lVar1 + 8 + lVar2 * 8) = 0xffffffffffffffff;
      }
    }
    puVar3 = &drumset;
    if (percussion == 0) {
      puVar3 = &tonebank;
    }
    lVar1 = puVar3[banknum];
    if ((lVar1 != 0) && (*(long *)(lVar1 + 8 + lVar2 * 8) == 0)) {
      *(undefined8 *)(lVar1 + 8 + lVar2 * 8) = 0xffffffffffffffff;
      return;
    }
  }
  return;
}

Assistant:

void Renderer::MarkInstrument(int banknum, int percussion, int instr)
{
	ToneBank *bank;

	if (banknum >= MAXBANK)
	{
		return;
	}
	if (banknum != 0)
	{
		/* Mark the standard bank in case it's not defined by this one. */
		MarkInstrument(0, percussion, instr);
	}
	if (percussion)
	{
		bank = drumset[banknum];
	}
	else
	{
		bank = tonebank[banknum];
	}
	if (bank == NULL)
	{
		return;
	}
	if (bank->instrument[instr] == NULL)
	{
		bank->instrument[instr] = MAGIC_LOAD_INSTRUMENT;
	}
}